

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O0

int __thiscall OpenMD::Shake::constraintPairR(Shake *this,ConstraintPair *consPair)

{
  ConstraintPair *in_RSI;
  ConstraintElem *in_RDI;
  double dVar1;
  RealType RVar2;
  double dVar3;
  double dVar4;
  Vector3d delta;
  RealType gab;
  RealType rmb;
  RealType rma;
  RealType rpabsq;
  RealType rpab;
  Vector3d rab;
  Vector3d oldPosB;
  Vector3d oldPosA;
  RealType diffsq;
  RealType rabsq;
  RealType pabsq;
  Vector3d pab;
  Vector3d posB;
  Vector3d posA;
  ConstraintElem *consElem2;
  ConstraintElem *consElem1;
  ConstraintElem *in_stack_fffffffffffffe68;
  Vector<double,_3U> *in_stack_fffffffffffffe78;
  Vector<double,_3U> *in_stack_fffffffffffffe80;
  Vector3d *in_stack_fffffffffffffee8;
  Snapshot *in_stack_fffffffffffffef0;
  int local_4;
  
  ConstraintPair::getConsElem1(in_RSI);
  ConstraintPair::getConsElem2(in_RSI);
  ConstraintElem::getPos(in_stack_fffffffffffffe68);
  ConstraintElem::getPos(in_stack_fffffffffffffe68);
  OpenMD::operator-(in_stack_fffffffffffffe78,(Vector<double,_3U> *)in_RDI);
  Vector3<double>::Vector3
            ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe68);
  Snapshot::wrapVector(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  dVar1 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x18e46d);
  RVar2 = ConstraintPair::getConsDistSquare(in_RSI);
  dVar1 = RVar2 - dVar1;
  if (ABS(dVar1) <=
      (double)(in_RDI->moved_).
              super___shared_ptr<OpenMD::SimpleTypeData<bool>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi * RVar2 * 2.0) {
    local_4 = 1;
  }
  else {
    ConstraintElem::getPrevPos(in_stack_fffffffffffffe68);
    ConstraintElem::getPrevPos(in_stack_fffffffffffffe68);
    OpenMD::operator-(in_stack_fffffffffffffe78,(Vector<double,_3U> *)in_RDI);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe68);
    Snapshot::wrapVector(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    dVar3 = dot<double,3u>(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (RVar2 * -dVar1 <= dVar3 * dVar3) {
      RVar2 = ConstraintElem::getMass((ConstraintElem *)0x18e5e8);
      dVar4 = 1.0 / RVar2;
      RVar2 = ConstraintElem::getMass((ConstraintElem *)0x18e60d);
      OpenMD::operator*(in_stack_fffffffffffffe78,(double)in_RDI);
      Vector3<double>::Vector3
                ((Vector3<double> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe68);
      OpenMD::operator*((double)in_stack_fffffffffffffe78,(Vector<double,_3U> *)in_RDI);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe68);
      ConstraintElem::setPos(in_RDI,(Vector3d *)in_stack_fffffffffffffe68);
      OpenMD::operator*((double)in_stack_fffffffffffffe78,(Vector<double,_3U> *)in_RDI);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_stack_fffffffffffffe68);
      ConstraintElem::setPos(in_RDI,(Vector3d *)in_stack_fffffffffffffe68);
      ConstraintPair::setConstraintForce(in_RSI,dVar1 / ((dVar4 + 1.0 / RVar2) * 2.0 * dVar3));
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int Shake::constraintPairR(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d pab = posA - posB;

    // periodic boundary condition

    currentSnapshot_->wrapVector(pab);

    RealType pabsq = pab.lengthSquare();

    RealType rabsq  = consPair->getConsDistSquare();
    RealType diffsq = rabsq - pabsq;

    // the original rattle code from alan tidesley
    if (fabs(diffsq) > (consTolerance_ * rabsq * 2)) {
      Vector3d oldPosA = consElem1->getPrevPos();
      Vector3d oldPosB = consElem2->getPrevPos();

      Vector3d rab = oldPosA - oldPosB;

      currentSnapshot_->wrapVector(rab);

      RealType rpab   = dot(rab, pab);
      RealType rpabsq = rpab * rpab;

      if (rpabsq < (rabsq * -diffsq)) { return consFail; }

      RealType rma = 1.0 / consElem1->getMass();
      RealType rmb = 1.0 / consElem2->getMass();

      RealType gab = diffsq / (2.0 * (rma + rmb) * rpab);

      Vector3d delta = rab * gab;

      // set atom1's position
      posA += rma * delta;
      consElem1->setPos(posA);

      // set atom2's position
      posB -= rmb * delta;
      consElem2->setPos(posB);

      // report the constraint force back to the constraint pair:
      consPair->setConstraintForce(gab);
      return consSuccess;
    } else
      return consAlready;
  }